

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SubDComponentPoint *
ON_SubDComponentPoint::BestPickPoint
          (ON_SubDComponentPoint *__return_storage_ptr__,ON_PickType pick_type,
          double vertex_depth_bias,double edge_depth_bias,ON_SubDComponentPoint *A,
          ON_SubDComponentPoint *B)

{
  ON__UINT_PTR OVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Type a;
  Type b;
  bool bVar7;
  Type TVar8;
  int iVar9;
  ON_SubDComponentPoint *pOVar10;
  long lVar11;
  long lVar12;
  ON_PickPoint *pOVar13;
  ON_PickPoint *b_00;
  ON_PickPoint *pOVar14;
  ON_SubDComponentPoint *pOVar15;
  double *pdVar16;
  byte bVar17;
  double dVar18;
  ON_PickPoint biased_B;
  ON_PickPoint biased_A;
  
  bVar17 = 0;
  pOVar13 = &A->m_pick_point;
  b_00 = &B->m_pick_point;
  iVar9 = ON_PickPoint::Compare(pOVar13,b_00);
  a = ON_SubDComponentPtr::ComponentType(&A->m_component_ptr);
  b = ON_SubDComponentPtr::ComponentType(&B->m_component_ptr);
  pOVar10 = __return_storage_ptr__;
  if (a == b) {
    if (iVar9 < 0) {
      A = B;
    }
LAB_005ceb6e:
    lVar11 = 10;
    B = A;
LAB_005cebb1:
    for (; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pOVar10->m_component_ptr).m_ptr = (B->m_component_ptr).m_ptr;
      B = (ON_SubDComponentPoint *)((long)B + (ulong)bVar17 * -0x10 + 8);
      pOVar10 = (ON_SubDComponentPoint *)((long)pOVar10 + (ulong)bVar17 * -0x10 + 8);
    }
    return __return_storage_ptr__;
  }
  if (a == Unset) {
    lVar11 = 10;
    goto LAB_005cebb1;
  }
  if (b == Unset) goto LAB_005ceb6e;
  iVar9 = ON_SubDComponentPtr::CompareComponentPtrType(a,b);
  if (pick_type == PointPick) {
    pOVar10 = B;
    pOVar15 = A;
    if (0 < iVar9) {
      pOVar10 = A;
      pOVar15 = B;
    }
    bVar7 = Internal_FirstIsPartOfSecond(pOVar15,pOVar10);
    if ((bVar7) && (b != Face && a != Face)) {
      pOVar10 = B;
      if (iVar9 < 1) {
        pOVar10 = A;
      }
      OVar1 = (pOVar10->m_component_ptr).m_ptr;
      dVar18 = (pOVar10->m_pick_point).m_point.x;
      dVar2 = (pOVar10->m_pick_point).m_point.y;
      dVar3 = (pOVar10->m_pick_point).m_point.z;
      dVar4 = (pOVar10->m_pick_point).m_t[0];
      dVar5 = (pOVar10->m_pick_point).m_t[1];
      dVar6 = (pOVar10->m_pick_point).m_t[3];
      (__return_storage_ptr__->m_pick_point).m_t[2] = (pOVar10->m_pick_point).m_t[2];
      (__return_storage_ptr__->m_pick_point).m_t[3] = dVar6;
      (__return_storage_ptr__->m_pick_point).m_t[0] = dVar4;
      (__return_storage_ptr__->m_pick_point).m_t[1] = dVar5;
      (__return_storage_ptr__->m_pick_point).m_point.y = dVar2;
      (__return_storage_ptr__->m_pick_point).m_point.z = dVar3;
      (__return_storage_ptr__->m_component_ptr).m_ptr = OVar1;
      (__return_storage_ptr__->m_pick_point).m_point.x = dVar18;
      goto LAB_005cee49;
    }
    lVar11 = 9;
    pOVar14 = &biased_A;
    for (lVar12 = lVar11; lVar12 != 0; lVar12 = lVar12 + -1) {
      (pOVar14->m_point).x = (pOVar13->m_point).x;
      pOVar13 = (ON_PickPoint *)((long)pOVar13 + (ulong)bVar17 * -0x10 + 8);
      pOVar14 = (ON_PickPoint *)((long)pOVar14 + (ulong)bVar17 * -0x10 + 8);
    }
    pOVar13 = &biased_B;
    for (; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pOVar13->m_point).x = (b_00->m_point).x;
      b_00 = (ON_PickPoint *)((long)b_00 + (ulong)bVar17 * -0x10 + 8);
      pOVar13 = (ON_PickPoint *)((long)pOVar13 + (ulong)bVar17 * -0x10 + 8);
    }
    if (((iVar9 < 1) && (0.0 < biased_A.m_distance)) && (biased_A.m_distance <= 1.0)) {
      biased_A.m_distance = 0.0;
    }
    if (((0 < iVar9) && (0.0 < biased_B.m_distance)) && (biased_B.m_distance <= 1.0)) {
      biased_B.m_distance = 0.0;
    }
  }
  else {
    lVar11 = 9;
    pOVar14 = &biased_A;
    for (lVar12 = lVar11; lVar12 != 0; lVar12 = lVar12 + -1) {
      (pOVar14->m_point).x = (pOVar13->m_point).x;
      pOVar13 = (ON_PickPoint *)((long)pOVar13 + (ulong)bVar17 * -0x10 + 8);
      pOVar14 = (ON_PickPoint *)((long)pOVar14 + (ulong)bVar17 * -0x10 + 8);
    }
    pOVar13 = &biased_B;
    for (; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pOVar13->m_point).x = (b_00->m_point).x;
      b_00 = (ON_PickPoint *)((long)b_00 + (ulong)bVar17 * -0x10 + 8);
      pOVar13 = (ON_PickPoint *)((long)pOVar13 + (ulong)bVar17 * -0x10 + 8);
    }
  }
  pdVar16 = &biased_A.m_depth;
  if (((1.23432101234321e+308 <= vertex_depth_bias) || (vertex_depth_bias <= 0.0)) ||
     (a != Vertex && b != Vertex)) {
    dVar18 = 0.0;
    if ((a == Edge || b == Edge) &&
       ((0.0 < edge_depth_bias && edge_depth_bias < 1.23432101234321e+308) &&
        (b == Face || a == Face))) {
      bVar7 = Internal_FirstIsPartOfSecond(A,B);
      if (!bVar7) {
        bVar7 = Internal_FirstIsPartOfSecond(B,A);
        goto joined_r0x005cee95;
      }
      goto LAB_005cedc7;
    }
  }
  else {
    bVar7 = Internal_FirstIsPartOfSecond(A,B);
    edge_depth_bias = vertex_depth_bias;
    if (!bVar7) {
      bVar7 = Internal_FirstIsPartOfSecond(B,A);
joined_r0x005cee95:
      dVar18 = 0.0;
      pdVar16 = &biased_B.m_depth;
      if (!bVar7) goto LAB_005ceddb;
    }
LAB_005cedc7:
    *pdVar16 = *pdVar16 + edge_depth_bias;
    dVar18 = edge_depth_bias;
  }
LAB_005ceddb:
  iVar9 = ON_PickPoint::Compare(&biased_A,&biased_B);
  pOVar10 = A;
  if (iVar9 < 0) {
    pOVar10 = B;
  }
  pOVar15 = __return_storage_ptr__;
  for (lVar11 = 10; lVar11 != 0; lVar11 = lVar11 + -1) {
    (pOVar15->m_component_ptr).m_ptr = (pOVar10->m_component_ptr).m_ptr;
    pOVar10 = (ON_SubDComponentPoint *)((long)pOVar10 + (ulong)bVar17 * -0x10 + 8);
    pOVar15 = (ON_SubDComponentPoint *)((long)pOVar15 + (ulong)bVar17 * -0x10 + 8);
  }
  TVar8 = ON_SubDComponentPtr::ComponentType(&__return_storage_ptr__->m_component_ptr);
  if (TVar8 != Vertex) {
    if (TVar8 != Edge) {
      return __return_storage_ptr__;
    }
    if (b != Face && a != Face) {
      return __return_storage_ptr__;
    }
  }
  if (dVar18 < ABS((A->m_pick_point).m_depth - (B->m_pick_point).m_depth)) {
    return __return_storage_ptr__;
  }
LAB_005cee49:
  dVar18 = ON_Min((A->m_pick_point).m_distance,(B->m_pick_point).m_distance);
  (__return_storage_ptr__->m_pick_point).m_distance = dVar18;
  dVar18 = ON_Max((A->m_pick_point).m_depth,(B->m_pick_point).m_depth);
  (__return_storage_ptr__->m_pick_point).m_depth = dVar18;
  return __return_storage_ptr__;
}

Assistant:

const ON_SubDComponentPoint ON_SubDComponentPoint::BestPickPoint(
  ON_PickType pick_type,
  double vertex_depth_bias,
  double edge_depth_bias,
  const ON_SubDComponentPoint& A,
  const ON_SubDComponentPoint& B
)
{
  // If you're working on a bug where somebody isn't able to pick the SubD component
  // they thought they clicked on, then you're in the right place.
  // Mikko has done lots of work in this area and be sure to retest RH-52172 and RH-52173 (fixed 3 May 2019).
  // Also, retest RH-59666 (fixed August 2020).
  //
  // This function will be a work in progress for many years.

  // unbiased_compare ignores SubD component types and relative topological relationships.
  // If unbiased_compare == 1, then A is "best" from this "unbiased" point of views.
  const int unbiased_compare = (ON_PickPoint::Compare(A.m_pick_point, B.m_pick_point)>=0) ? 1 : -1;
  
  const ON_SubDComponentPtr::Type A_component_type = A.m_component_ptr.ComponentType();
  const ON_SubDComponentPtr::Type B_component_type = B.m_component_ptr.ComponentType();
  if (A_component_type == B_component_type)
  {
    // A and B are the same type of component
    return (unbiased_compare >= 0) ? A : B;
  }
  if (ON_SubDComponentPtr::Type::Unset == A_component_type)
    return B;
  if (ON_SubDComponentPtr::Type::Unset == B_component_type)
    return A;

  // If we get this far, then A and B are pick events on different types of SubD components.

  // type_bias = 1 if A is a vertex and B is an edge/face or A is an edge and B is a face.
  // type_bias = -1 if B is a vertex and A is an edge/face or B is an edge and A is a face.
  const int type_bias = (ON_SubDComponentPtr::CompareComponentPtrType(A_component_type, B_component_type)) <= 0 ? 1 : -1;

  // 17 Dec 2024, Mikko, RH-85024:
  // Skip the following section if either component is a face. 
  // In that case it gives the wrong answer if you click on an opaque shaded SubD face, 
  // and at the same time hit an edge/vertex of the same face behind the shaded part.
  if (
    ON_PickType::PointPick == pick_type
    && ((type_bias >= 0) ? Internal_FirstIsPartOfSecond(A, B) : Internal_FirstIsPartOfSecond(B, A))
    && ON_SubDComponentPtr::Type::Face != A_component_type
    && ON_SubDComponentPtr::Type::Face != B_component_type
    )
  {
    // A point pick is occurring and best is a vertex on an edge/face or best is an edge on a face.
    // Bias towards the vertex/edge.
    // Users can pick the middle of an edge/face if they want the "bigger" component.
    ON_SubDComponentPoint best = (type_bias >= 0) ? A : B;
    best.m_pick_point.m_distance = ON_Min(A.m_pick_point.m_distance, B.m_pick_point.m_distance);
    best.m_pick_point.m_depth = ON_Max(A.m_pick_point.m_depth, B.m_pick_point.m_depth);
    return best;
  }

  ON_PickPoint biased_A(A.m_pick_point);
  ON_PickPoint biased_B(B.m_pick_point);

  // distance bias applied to point picks on vertices and edges
  // Events with smaller distances are "better" because they are visually are closer to the picked point.
  if (ON_PickType::PointPick == pick_type)
  {
    // 18 Aug 2020 Dale Lear:
    //   The pick distance for a point pick is normalized so 1.0 = pick frustum radius. 
    //   Reasonable values for distance_tol are 0.25 to 1.0.
    //   0.5 fixes RH-52172
    //   1.0 seems to fix bugs like RH-59666 (0.5 is too small to fix RH-59666).
    const double distance_tol = 1.0;

    if ( type_bias > 0 && biased_A.m_distance > 0.0 && biased_A.m_distance <= distance_tol)
      biased_A.m_distance = 0.0; // consider pick A to be on the vertex/edge

    if ( type_bias < 0 && biased_B.m_distance > 0.0 && biased_B.m_distance <= distance_tol )
      biased_B.m_distance = 0.0; // consider pick B to be on the vertex/edge
  }

  // Apply a depth bias when we have a relative topological relationship between the components
  // (vertex on edge, vertex on face, or edge on face).
  // Events with larger depths are "better" because they are in front of smaller depths.
  double depth_bias = 0.0;
  const bool bHaveVertex = ON_SubDComponentPtr::Type::Vertex == A_component_type || ON_SubDComponentPtr::Type::Vertex == B_component_type;
  const bool bHaveEdge = ON_SubDComponentPtr::Type::Edge == A_component_type || ON_SubDComponentPtr::Type::Edge == B_component_type;
  const bool bHaveFace = ON_SubDComponentPtr::Type::Face == A_component_type || ON_SubDComponentPtr::Type::Face == B_component_type;
  if ( bHaveVertex && vertex_depth_bias > 0.0 && vertex_depth_bias < ON_UNSET_POSITIVE_VALUE  )
  {
    // One event is a vertex, the other event is an edge or face, and a vertex bias was supplied.
    // Test to see if the vertex is on the edge or face.
    if (Internal_FirstIsPartOfSecond(A,B))
    {
      // B is an edge/face and A is a vertex on the edge/face
      depth_bias = vertex_depth_bias;
      biased_A.m_depth += depth_bias; // bias vertex closer
    }
    else if (Internal_FirstIsPartOfSecond(B, A))
    {
      // A is an edge/face and B is a vertex on the edge/face
      depth_bias = vertex_depth_bias;
      biased_B.m_depth += depth_bias; // bias vertex closer
    }
  }
  else if ( bHaveEdge && bHaveFace && edge_depth_bias > 0.0  && edge_depth_bias < ON_UNSET_POSITIVE_VALUE )
  {
    // One event is an edge, the other event is a face, and an edge bias was supplied.
    // Test to see if the edge is on the face.
    if (Internal_FirstIsPartOfSecond(A, B))
    {
      // B is a face and A is an edge on the face
      depth_bias = edge_depth_bias;
      biased_A.m_depth += depth_bias; // bias edge closer
    }
    else if (Internal_FirstIsPartOfSecond(B, A))
    {
      // A is a face and B is an edge on the face
      depth_bias = edge_depth_bias;
      biased_B.m_depth += depth_bias; // bias edge closer
    }
  }

  // biased_compare adds a bias towards vertices and edges based on SubD component types and relative topological relationships.
  // If biased_compare >= 0, then A is "best" from this biased point of views.
  const int biased_compare = (ON_PickPoint::Compare(biased_A, biased_B)>=0) ? 1 : -1;

  ON_SubDComponentPoint best = (biased_compare >= 0) ? A : B;

  const ON_SubDComponentPtr::Type best_type = best.m_component_ptr.ComponentType();
  if ( ON_SubDComponentPtr::Type::Vertex == best_type || (ON_SubDComponentPtr::Type::Edge == best_type && bHaveFace) )
  {
    // Either a vertex was better than an edge/face or an edge was better than a face.
    if (fabs(A.m_pick_point.m_depth - B.m_pick_point.m_depth) <= depth_bias)
    {
      // The two pick points were "close" in depth.
      // In these cases, strengthen "best" by using the "best" depth and distance values from A and B.
      best.m_pick_point.m_distance = ON_Min(A.m_pick_point.m_distance, B.m_pick_point.m_distance);
      best.m_pick_point.m_depth = ON_Max(A.m_pick_point.m_depth, B.m_pick_point.m_depth);
    }
  }

  return best;
}